

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O2

DynamicObject * __thiscall
Js::LazyJSONString::ReconstructObject(LazyJSONString *this,JSONObject *valueList)

{
  JavascriptString *obj;
  code *pcVar1;
  SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *pSVar2;
  bool bVar3;
  DynamicObject *object;
  undefined4 *puVar4;
  Type *pTVar5;
  Var propertyValue;
  PropertyString *this_00;
  undefined1 local_90 [8];
  PropertyValueInfo info;
  PropertyRecord *localPropertyRecord;
  Iterator local_40;
  
  object = JavascriptLibrary::CreateObject
                     ((((this->super_JavascriptString).super_RecyclableObject.type.ptr)->
                      javascriptLibrary).ptr,true,
                      (PropertyIndex)
                      (valueList->super_SList<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>).
                      super_SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>.
                      super_RealCount.count);
  local_40.list = (SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)valueList;
  local_40.current = (NodeBase *)valueList;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while( true ) {
    if ((RecyclableObject *)valueList == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    pSVar2 = local_40.list;
    SListNodeBase<Memory::Recycler>::Next((SListNodeBase<Memory::Recycler> *)local_90);
    if (local_90 == (undefined1  [8])pSVar2) break;
    SListNodeBase<Memory::Recycler>::Next((SListNodeBase<Memory::Recycler> *)local_90);
    local_40.current = (NodeBase *)local_90;
    pTVar5 = SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>::Iterator::Data
                       (&local_40);
    propertyValue = ReconstructVar(this,&pTVar5->propertyValue);
    obj = (pTVar5->propertyName).ptr;
    bVar3 = VarIsImpl<Js::PropertyString>(&obj->super_RecyclableObject);
    if (bVar3) {
      this_00 = UnsafeVarTo<Js::PropertyString,Js::JavascriptString>(obj);
    }
    else {
      this_00 = (PropertyString *)0x0;
    }
    local_90 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    if ((this_00 == (PropertyString *)0x0) ||
       (bVar3 = PropertyString::TrySetPropertyFromCache
                          (this_00,&object->super_RecyclableObject,propertyValue,
                           (((((this->super_JavascriptString).super_RecyclableObject.type.ptr)->
                             javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
                           ,PropertyOperation_None,(PropertyValueInfo *)local_90),
       valueList = (JSONObject *)local_40.current, !bVar3)) {
      (*(obj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x61])(obj,&info.inlineCacheIndex,0);
      JavascriptOperators::SetProperty
                (object,&object->super_RecyclableObject,*(PropertyId *)(info._56_8_ + 8),
                 propertyValue,(PropertyValueInfo *)local_90,
                 (((((this->super_JavascriptString).super_RecyclableObject.type.ptr)->
                   javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                 PropertyOperation_None);
      valueList = (JSONObject *)local_40.current;
    }
  }
  return object;
}

Assistant:

DynamicObject*
LazyJSONString::ReconstructObject(_In_ JSONObject* valueList) const
{
    const uint elementCount = valueList->Count();

    // This is just a heuristic, so overflow doesn't matter
    PropertyIndex requestedInlineSlotCapacity = static_cast<PropertyIndex>(elementCount);

    DynamicObject* obj = this->GetLibrary()->CreateObject(
        true, // allowObjectHeaderInlining
        requestedInlineSlotCapacity);

    FOREACH_SLISTCOUNTED_ENTRY(JSONObjectProperty, entry, valueList)
    {
        Var propertyValue = ReconstructVar(&entry.propertyValue);
        JavascriptString* propertyName = entry.propertyName;
        PropertyString* propertyString = JavascriptOperators::TryFromVar<PropertyString>(propertyName);
        PropertyValueInfo info;
        if (!propertyString || !propertyString->TrySetPropertyFromCache(obj, propertyValue, this->GetScriptContext(), PropertyOperation_None, &info))
        {
            Js::PropertyRecord const * localPropertyRecord;
            propertyName->GetPropertyRecord(&localPropertyRecord);
            JavascriptOperators::SetProperty(obj, obj, localPropertyRecord->GetPropertyId(),
                propertyValue, &info, this->GetScriptContext());
        }
    }
    NEXT_SLISTCOUNTED_ENTRY;
    return obj;
}